

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_3537c6::Db::parseAbiTags(Db *this,Node *N)

{
  Cache CVar1;
  Cache CVar2;
  Cache CVar3;
  char *pcVar4;
  Node *pNVar5;
  StringView SVar6;
  
  pcVar4 = this->First;
  if (pcVar4 != this->Last) {
    pNVar5 = N;
    do {
      if (*pcVar4 != 'B') {
        return pNVar5;
      }
      this->First = pcVar4 + 1;
      SVar6 = parseBareSourceName(this);
      if (SVar6.First == SVar6.Last) {
        return (Node *)0x0;
      }
      N = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      CVar2 = pNVar5->RHSComponentCache;
      CVar3 = pNVar5->ArrayCache;
      CVar1 = pNVar5->FunctionCache;
      N->K = KAbiTagAttr;
      N->RHSComponentCache = CVar2;
      N->ArrayCache = CVar3;
      N->FunctionCache = CVar1;
      N->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d43a8;
      N[1]._vptr_Node = (_func_int **)pNVar5;
      *(StringView *)&N[1].K = SVar6;
      pcVar4 = this->First;
      pNVar5 = N;
    } while (pcVar4 != this->Last);
  }
  return N;
}

Assistant:

Node *Db::parseAbiTags(Node *N) {
  while (consumeIf('B')) {
    StringView SN = parseBareSourceName();
    if (SN.empty())
      return nullptr;
    N = make<AbiTagAttr>(N, SN);
  }
  return N;
}